

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorPoolDatabase::FindAllExtensionNumbers
          (DescriptorPoolDatabase *this,string *extendee_type,
          vector<int,_std::allocator<int>_> *output)

{
  Descriptor *extendee;
  int i;
  ulong uVar1;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  extensions;
  int local_3c;
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_38;
  
  extendee = DescriptorPool::FindMessageTypeByName(this->pool_,extendee_type);
  if (extendee != (Descriptor *)0x0) {
    local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    DescriptorPool::FindAllExtensions
              (this->pool_,extendee,
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)&local_38);
    for (uVar1 = 0;
        uVar1 < (ulong)((long)local_38._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_38._M_impl.super__Vector_impl_data._M_start >> 3);
        uVar1 = uVar1 + 1) {
      local_3c = *(int *)(local_38._M_impl.super__Vector_impl_data._M_start[uVar1] + 0x38);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,&local_3c);
    }
    std::
    _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~_Vector_base(&local_38);
  }
  return extendee != (Descriptor *)0x0;
}

Assistant:

bool DescriptorPoolDatabase::FindAllExtensionNumbers(
    const string& extendee_type,
    std::vector<int>* output) {
  const Descriptor* extendee = pool_.FindMessageTypeByName(extendee_type);
  if (extendee == NULL) return false;

  std::vector<const FieldDescriptor*> extensions;
  pool_.FindAllExtensions(extendee, &extensions);

  for (int i = 0; i < extensions.size(); ++i) {
    output->push_back(extensions[i]->number());
  }

  return true;
}